

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.cpp
# Opt level: O3

void __thiscall Atari2600::TIA::output_for_cycles(TIA *this,int number_of_cycles)

{
  PlayfieldPriority PVar1;
  ScanTarget *pSVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  uint16_t *puVar7;
  uint uVar8;
  int iVar9;
  size_t number_of_samples;
  uint start;
  long lVar10;
  uint uVar11;
  undefined4 extraout_var;
  
  start = this->horizontal_counter_;
  uVar11 = number_of_cycles + start;
  this->horizontal_counter_ = uVar11;
  bVar3 = (int)start < 0xe0;
  bVar4 = 0xdf < (int)uVar11;
  if (start == 0) {
    memset(this->collision_buffer_,0,0xa0);
    (this->ball_).super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.motion_time =
         (this->ball_).super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.motion_time %
         0xe4;
    this->player_[0].super_Object<Atari2600::TIA::Player>.motion_time =
         this->player_[0].super_Object<Atari2600::TIA::Player>.motion_time % 0xe4;
    this->player_[1].super_Object<Atari2600::TIA::Player>.motion_time =
         this->player_[1].super_Object<Atari2600::TIA::Player>.motion_time % 0xe4;
    this->missile_[0].super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.motion_time =
         this->missile_[0].super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.
         motion_time % 0xe4;
    this->missile_[1].super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.motion_time =
         this->missile_[1].super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.
         motion_time % 0xe4;
  }
  if (0x3f < (int)uVar11) {
    uVar5 = 0x40;
    if (0x40 < (int)start) {
      uVar5 = start;
    }
    uVar8 = 0xe0;
    if (uVar11 < 0xe0) {
      uVar8 = uVar11;
    }
    uVar5 = uVar5 + 7 & 0x7ffffffc;
    if (uVar5 < uVar8 + 4) {
      uVar6 = (ulong)uVar5;
      do {
        iVar9 = (int)uVar6 + -0x44 >> 2;
        uVar11 = 0x1010101;
        if ((this->background_[this->background_half_mask_ & iVar9 / 0x14] >> (iVar9 % 0x14 & 0x1fU)
            & 1) == 0) {
          uVar11 = 0;
        }
        *(uint *)(this->collision_buffer_ + (uVar6 - 0x44)) =
             *(uint *)(this->collision_buffer_ + (uVar6 - 0x44)) | uVar11;
        uVar6 = uVar6 + 4;
      } while (uVar6 < uVar8 + 4);
      uVar11 = this->horizontal_counter_;
    }
  }
  draw_object<Atari2600::TIA::Player>(this,this->player_,'\x04',start,uVar11);
  draw_object<Atari2600::TIA::Player>(this,this->player_ + 1,'\b',start,this->horizontal_counter_);
  draw_missile(this,this->missile_,this->player_,'\x10',start,this->horizontal_counter_);
  draw_missile(this,this->missile_ + 1,this->player_ + 1,' ',start,this->horizontal_counter_);
  draw_object<Atari2600::TIA::Ball>(this,&this->ball_,'\x02',start,this->horizontal_counter_);
  if ((this->output_mode_ | 2U) == 3) {
    if ((int)start < 0x10) {
      iVar9 = this->horizontal_counter_;
      if (0x10 < iVar9) {
        Outputs::CRT::CRT::output_sync(&this->crt_,start * -2 + 0x20);
        start = 0x10;
LAB_002fa636:
        iVar9 = this->horizontal_counter_;
        if (iVar9 < 0x21) goto LAB_002fa641;
        Outputs::CRT::CRT::output_blank(&this->crt_,start * -2 + 0x40);
        start = 0x20;
LAB_002fa6a6:
        iVar9 = this->horizontal_counter_;
        if (iVar9 < 0x31) goto LAB_002fa6fb;
        Outputs::CRT::CRT::output_default_colour_burst(&this->crt_,start * -2 + 0x60,')');
        start = 0x30;
        goto LAB_002fa6cc;
      }
    }
    else {
      if (start < 0x20) goto LAB_002fa636;
      if (start < 0x30) goto LAB_002fa6a6;
      if (0xe3 < start) goto LAB_002fa770;
LAB_002fa6cc:
      iVar9 = this->horizontal_counter_;
      if (0xe4 < iVar9) {
        Outputs::CRT::CRT::output_sync(&this->crt_,start * -2 + 0x1c8);
        start = 0xe4;
        goto LAB_002fa770;
      }
    }
LAB_002fa6da:
    Outputs::CRT::CRT::output_sync(&this->crt_,(iVar9 - start) * 2);
  }
  else {
    if ((int)start < 0x10) {
      iVar9 = this->horizontal_counter_;
      if (0x10 < iVar9) {
        Outputs::CRT::CRT::output_blank(&this->crt_,start * -2 + 0x20);
        start = 0x10;
LAB_002fa65b:
        iVar9 = this->horizontal_counter_;
        if (iVar9 < 0x21) goto LAB_002fa6da;
        Outputs::CRT::CRT::output_sync(&this->crt_,start * -2 + 0x40);
        start = 0x20;
LAB_002fa6f0:
        iVar9 = this->horizontal_counter_;
        if (0x30 < iVar9) {
          Outputs::CRT::CRT::output_default_colour_burst(&this->crt_,start * -2 + 0x60,')');
          start = 0x30;
          goto LAB_002fa74b;
        }
LAB_002fa6fb:
        Outputs::CRT::CRT::output_default_colour_burst(&this->crt_,(iVar9 - start) * 2,')');
        goto LAB_002fab63;
      }
LAB_002fa641:
      Outputs::CRT::CRT::output_blank(&this->crt_,(iVar9 - start) * 2);
      goto LAB_002fab63;
    }
    if (start < 0x20) goto LAB_002fa65b;
    if (start < 0x30) goto LAB_002fa6f0;
    if (0x43 < start) goto LAB_002fa770;
LAB_002fa74b:
    iVar9 = this->horizontal_counter_;
    if (iVar9 < 0x45) goto LAB_002fa641;
    Outputs::CRT::CRT::output_blank(&this->crt_,start * -2 + 0x88);
    start = 0x44;
LAB_002fa770:
    if ((this->output_mode_ & 2) == 0) {
      if (this->pixels_start_location_ == 0) {
        this->pixels_start_location_ = start;
        pSVar2 = (this->crt_).scan_target_;
        iVar9 = (*pSVar2->_vptr_ScanTarget[5])(pSVar2,0xa0,1);
        puVar7 = (uint16_t *)CONCAT44(extraout_var,iVar9);
        (this->crt_).allocated_data_length_ = -(ulong)(puVar7 == (uint16_t *)0x0) | 0xa0;
        this->pixel_target_ = puVar7;
      }
      else {
        puVar7 = this->pixel_target_;
      }
      if (puVar7 != (uint16_t *)0x0) {
        uVar11 = this->pixels_start_location_;
        uVar5 = start;
        if ((int)start < (int)uVar11) {
          uVar5 = uVar11;
        }
        uVar8 = this->horizontal_counter_;
        iVar9 = uVar5 - uVar11;
        if ((uVar5 < 0x4c) && (this->horizontal_blank_extend_ == true)) {
          uVar11 = 0x4c;
          if ((int)uVar8 < 0x4c) {
            uVar11 = uVar8;
          }
          if ((int)uVar5 < (int)uVar11) {
            lVar10 = 0;
            do {
              puVar7[iVar9 + lVar10] = 0xff00;
              lVar10 = lVar10 + 1;
            } while (uVar11 - uVar5 != (int)lVar10);
            iVar9 = iVar9 + (int)lVar10;
            uVar5 = uVar11;
          }
        }
        PVar1 = this->playfield_priority_;
        if (PVar1 == Score) {
          uVar11 = 0x94;
          if ((int)uVar8 < 0x94) {
            uVar11 = uVar8;
          }
          if ((int)uVar5 < (int)uVar11) {
            lVar10 = 0;
            do {
              puVar7[iVar9 + lVar10] =
                   (this->colour_palette_)._M_elems
                   [this->colour_mask_by_mode_collision_flags_[1]
                    [this->collision_buffer_[lVar10 + (int)uVar5 + -0x44]]].luminance_phase;
              lVar10 = lVar10 + 1;
            } while ((long)(int)uVar11 - (long)(int)uVar5 != lVar10);
            iVar9 = iVar9 + (int)lVar10;
            uVar5 = uVar11;
          }
          if ((int)uVar5 < (int)uVar8) {
            lVar10 = 0;
            do {
              puVar7[iVar9 + lVar10] =
                   (this->colour_palette_)._M_elems
                   [this->colour_mask_by_mode_collision_flags_[2]
                    [this->collision_buffer_[lVar10 + (int)uVar5 + -0x44]]].luminance_phase;
              lVar10 = lVar10 + 1;
            } while ((long)(int)uVar8 - (long)(int)uVar5 != lVar10);
          }
        }
        else if ((int)uVar5 < (int)uVar8) {
          lVar10 = 0;
          do {
            puVar7[iVar9 + lVar10] =
                 (this->colour_palette_)._M_elems
                 [this->colour_mask_by_mode_collision_flags_[0]
                  [(ulong)this->collision_buffer_[lVar10 + (int)uVar5 + -0x44] +
                   (ulong)((uint)(PVar1 != Standard) * 0xc0)]].luminance_phase;
            lVar10 = lVar10 + 1;
          } while ((long)(int)uVar8 - (long)(int)uVar5 != lVar10);
        }
      }
      iVar9 = this->horizontal_counter_;
      if ((int)start < iVar9) {
        uVar11 = this->collision_flags_;
        uVar6 = (ulong)start + 0xffffffbc;
        do {
          uVar11 = uVar11 | this->collision_flags_by_buffer_vaules_
                            [this->collision_buffer_[uVar6 & 0xffffffff]];
          this->collision_flags_ = uVar11;
          uVar6 = uVar6 + 1;
          start = start + 1;
        } while ((int)start < iVar9);
      }
      if (iVar9 == 0xe4) {
        number_of_samples = (long)(int)start - (long)this->pixels_start_location_;
        Outputs::CRT::CRT::output_data(&this->crt_,(int)number_of_samples * 2,number_of_samples);
        this->pixel_target_ = (uint16_t *)0x0;
        this->pixels_start_location_ = 0;
      }
    }
    else {
      puVar7 = this->pixel_target_;
      if (puVar7 != (uint16_t *)0x0) {
        uVar11 = this->pixels_start_location_;
        lVar10 = 0;
        uVar5 = uVar11;
        if (((int)uVar11 < 0x4c) && (this->horizontal_blank_extend_ == true)) {
          uVar8 = 0x4c;
          if (start < 0x4c) {
            uVar8 = start;
          }
          if ((int)uVar11 < (int)uVar8) {
            lVar10 = 0;
            do {
              puVar7[lVar10] = 0xff00;
              lVar10 = lVar10 + 1;
              uVar5 = uVar8;
            } while (uVar8 - uVar11 != (int)lVar10);
          }
        }
        PVar1 = this->playfield_priority_;
        iVar9 = (int)lVar10;
        if (PVar1 == Score) {
          uVar6 = 0x94;
          if ((int)start < 0x94) {
            uVar6 = (ulong)start;
          }
          if ((int)uVar5 < (int)(uint)uVar6) {
            lVar10 = 0;
            do {
              puVar7[iVar9 + lVar10] =
                   (this->colour_palette_)._M_elems
                   [this->colour_mask_by_mode_collision_flags_[1]
                    [this->collision_buffer_[lVar10 + (int)uVar5 + -0x44]]].luminance_phase;
              lVar10 = lVar10 + 1;
            } while (uVar6 - (long)(int)uVar5 != lVar10);
            iVar9 = iVar9 + (int)lVar10;
            uVar5 = (uint)uVar6;
          }
          if ((int)uVar5 < (int)start) {
            lVar10 = 0;
            do {
              puVar7[iVar9 + lVar10] =
                   (this->colour_palette_)._M_elems
                   [this->colour_mask_by_mode_collision_flags_[2]
                    [this->collision_buffer_[lVar10 + (int)uVar5 + -0x44]]].luminance_phase;
              lVar10 = lVar10 + 1;
            } while ((ulong)start - (long)(int)uVar5 != lVar10);
          }
        }
        else if ((int)uVar5 < (int)start) {
          lVar10 = 0;
          do {
            puVar7[iVar9 + lVar10] =
                 (this->colour_palette_)._M_elems
                 [this->colour_mask_by_mode_collision_flags_[0]
                  [(ulong)this->collision_buffer_[lVar10 + (int)uVar5 + -0x44] +
                   (ulong)((uint)(PVar1 != Standard) * 0xc0)]].luminance_phase;
            lVar10 = lVar10 + 1;
          } while ((ulong)start - (long)(int)uVar5 != lVar10);
        }
        Outputs::CRT::CRT::output_data(&this->crt_,(start - uVar11) * 2,(long)(int)(start - uVar11))
        ;
        this->pixel_target_ = (uint16_t *)0x0;
        this->pixels_start_location_ = 0;
      }
      iVar9 = 0xe4;
      if (this->horizontal_counter_ < 0xe4) {
        iVar9 = this->horizontal_counter_;
      }
      Outputs::CRT::CRT::output_blank(&this->crt_,(iVar9 - start) * 2);
    }
    if (bVar3 && bVar4) {
      this->horizontal_blank_extend_ = false;
    }
  }
LAB_002fab63:
  this->horizontal_counter_ = this->horizontal_counter_ % 0xe4;
  return;
}

Assistant:

void TIA::output_for_cycles(int number_of_cycles) {
	/*
		Line timing is oriented around 0 being the start of the right-hand side vertical blank;
		a wsync synchronises the CPU to horizontal_counter_ = 0. All timing below is in terms of the
		NTSC colour clock.

		Therefore, each line is composed of:

			16 cycles:	blank					; -> 16
			16 cycles:	sync					; -> 32
			16 cycles:	colour burst			; -> 48
			20 cycles:	blank					; -> 68
			8 cycles:	blank or pixels, depending on whether the blank extend bit is set
			152 cycles:	pixels
	*/
	int output_cursor = horizontal_counter_;
	horizontal_counter_ += number_of_cycles;
	bool is_reset = output_cursor < 224 && horizontal_counter_ >= 224;

	if(!output_cursor) {
		std::memset(collision_buffer_, 0, sizeof(collision_buffer_));

		ball_.motion_time %= 228;
		player_[0].motion_time %= 228;
		player_[1].motion_time %= 228;
		missile_[0].motion_time %= 228;
		missile_[1].motion_time %= 228;
	}

	// accumulate an OR'd version of the output into the collision buffer
	int latent_start = output_cursor + 4;
	int latent_end = horizontal_counter_ + 4;
	draw_playfield(latent_start, latent_end);
	draw_object<Player>(player_[0], uint8_t(CollisionType::Player0), output_cursor, horizontal_counter_);
	draw_object<Player>(player_[1], uint8_t(CollisionType::Player1), output_cursor, horizontal_counter_);
	draw_missile(missile_[0], player_[0], uint8_t(CollisionType::Missile0), output_cursor, horizontal_counter_);
	draw_missile(missile_[1], player_[1], uint8_t(CollisionType::Missile1), output_cursor, horizontal_counter_);
	draw_object<Ball>(ball_, uint8_t(CollisionType::Ball), output_cursor, horizontal_counter_);

	// convert to television signals

#define Period(function, target)	\
	if(output_cursor < target) { \
		if(horizontal_counter_ <= target) { \
			crt_.function((horizontal_counter_ - output_cursor) * 2); \
			horizontal_counter_ %= cycles_per_line; \
			return; \
		} else { \
			crt_.function((target - output_cursor) * 2); \
			output_cursor = target; \
		} \
	}

	switch(output_mode_) {
		default:
			Period(output_blank, 16)
			Period(output_sync, 32)
			Period(output_default_colour_burst, 48)
			Period(output_blank, 68)
		break;
		case sync_flag:
		case sync_flag | blank_flag:
			Period(output_sync, 16)
			Period(output_blank, 32)
			Period(output_default_colour_burst, 48)
			Period(output_sync, 228)
		break;
	}

#undef Period

	if(output_mode_ & blank_flag) {
		if(pixel_target_) {
			output_pixels(pixels_start_location_, output_cursor);
			const int data_length = int(output_cursor - pixels_start_location_);
			crt_.output_data(data_length * 2, size_t(data_length));
			pixel_target_ = nullptr;
			pixels_start_location_ = 0;
		}
		int duration = std::min(228, horizontal_counter_) - output_cursor;
		crt_.output_blank(duration * 2);
	} else {
		if(!pixels_start_location_) {
			pixels_start_location_ = output_cursor;
			pixel_target_ = reinterpret_cast<uint16_t *>(crt_.begin_data(160));
		}

		// convert that into pixels
		if(pixel_target_) output_pixels(output_cursor, horizontal_counter_);

		// accumulate collision flags
		while(output_cursor < horizontal_counter_) {
			collision_flags_ |= collision_flags_by_buffer_vaules_[collision_buffer_[output_cursor - first_pixel_cycle]];
			output_cursor++;
		}

		if(horizontal_counter_ == cycles_per_line) {
			const int data_length = int(output_cursor - pixels_start_location_);
			crt_.output_data(data_length * 2, size_t(data_length));
			pixel_target_ = nullptr;
			pixels_start_location_ = 0;
		}
	}

	if(is_reset) horizontal_blank_extend_ = false;

	horizontal_counter_ %= cycles_per_line;
}